

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotated_string.h
# Opt level: O0

const_iterator * __thiscall
agge::annotated_string<char,_agge::style_modifier>::const_iterator::operator++(const_iterator *this)

{
  bool bVar1;
  const_iterator *this_local;
  
  (this->_current).
  super_range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .begin_index = (this->_current).
                 super_range<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 .end_index;
  bVar1 = __gnu_cxx::operator!=(&this->_annotations_end,&this->_next_annotation);
  if (bVar1) {
    fetch_annotation(this);
  }
  return this;
}

Assistant:

inline typename annotated_string<CharT, AnnotationT>::const_iterator
		&annotated_string<CharT, AnnotationT>::const_iterator::operator ++()
	{
		_current.begin_index = _current.end_index;
		if (_annotations_end != _next_annotation)
			fetch_annotation();
		return *this;
	}